

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildIdentifier(CNscPStackEntry *pId)

{
  byte *pbVar1;
  size_t *psVar2;
  uint ulFlags;
  NscType nType;
  uchar *puVar3;
  size_t nSize;
  CNwnDoubleLinkList *pCVar4;
  CNscPStackEntry *pCVar5;
  CNscContext *pCVar6;
  CNscPStackEntry *this;
  NscSymbol *pNVar7;
  CNwnDoubleLinkList *pCVar8;
  CNwnDoubleLinkList *pNext;
  CNwnDoubleLinkList *pNext_1;
  char *pcVar9;
  NscMessage nMessage;
  int nStackOffset;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  pCVar6 = g_pCtx;
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pId != (CNscPStackEntry *)0x0) {
      pCVar4 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar5 = (CNscPStackEntry *)(pId->m_link).m_pNext;
      if (pCVar5 != pId) {
        pCVar8 = (pId->m_link).m_pPrev;
        (pCVar5->m_link).m_pPrev = pCVar8;
        pCVar8->m_pNext = (CNwnDoubleLinkList *)pCVar5;
        (pId->m_link).m_pNext = &pId->m_link;
        (pId->m_link).m_pPrev = &pId->m_link;
      }
      pCVar8 = &pCVar6->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar6->m_listEntryFree == pId) {
        pCVar8 = pCVar4;
      }
      pCVar4 = pCVar8->m_pNext;
      (pId->m_link).m_pNext = pCVar4;
      (pId->m_link).m_pPrev = pCVar8;
      pCVar8->m_pNext = &pId->m_link;
      pCVar4->m_pPrev = &pId->m_link;
    }
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = NscType_Unknown;
      return this;
    }
  }
  else {
    pNVar7 = CNscSymbolTable::FindByType(&g_pCtx->m_sSymbols,pId->m_pszId,0xfffffff7);
    if (pNVar7 == (NscSymbol *)0x0) {
      pcVar9 = pId->m_pszId;
      nMessage = NscMessage_ErrorUndeclaredIdentifier;
    }
    else {
      if (((pNVar7->field_6).field_2.ulFlags & 0x11000000) == 0x10000000) {
        CNscContext::GenerateMessage
                  (g_pCtx,NscMessage_WarningIdentUsedInInitializer,pNVar7->szString);
        pbVar1 = (byte *)((long)&pNVar7->field_6 + 7);
        *pbVar1 = *pbVar1 | 1;
      }
      if (pNVar7->nSymType == NscSymType_Structure) {
        pcVar9 = pId->m_pszId;
        nMessage = NscMessage_ErrorInvalidUseOfStructure;
      }
      else {
        if (pNVar7->nSymType != NscSymType_Function) {
          puVar3 = (g_pCtx->m_sSymbols).m_pauchData;
          ulFlags = (pNVar7->field_6).field_2.ulFlags;
          if ((char)ulFlags < '\0') {
            psVar2 = (size_t *)(puVar3 + (pNVar7->field_6).field_1.nFirstBackLink);
            nSize = *psVar2;
            CNscPStackEntry::MakeRoom(this,nSize);
            memcpy(this->m_pauchData + this->m_nDataSize,psVar2 + 2,nSize);
            this->m_nDataSize = this->m_nDataSize + nSize;
          }
          else {
            nType = (pNVar7->field_6).field_2.nType;
            if ((ulFlags & 1) == 0) {
              nStackOffset = (pNVar7->field_6).field_2.nStackOffset;
            }
            else {
              nStackOffset = 0;
            }
            CNscPStackEntry::PushVariable
                      (this,nType,nType,(long)pNVar7 - (long)puVar3,-1,nStackOffset,ulFlags);
          }
          if (this->m_nType != NscType_Unknown) goto LAB_00153876;
          this->m_nType = (pNVar7->field_6).field_0.nToken;
          pbVar1 = (byte *)((long)&pNVar7->field_6 + 7);
          *pbVar1 = *pbVar1 | 4;
          goto LAB_00153821;
        }
        pcVar9 = pId->m_pszId;
        nMessage = NscMessage_ErrorInvalidUseOfFunction;
      }
    }
    CNscContext::GenerateMessage(g_pCtx,nMessage,pcVar9);
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = NscType_Error;
LAB_00153821:
      pCVar6 = g_pCtx;
      pCVar4 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar5 = (CNscPStackEntry *)(pId->m_link).m_pNext;
      if (pCVar5 != pId) {
        pCVar8 = (pId->m_link).m_pPrev;
        (pCVar5->m_link).m_pPrev = pCVar8;
        pCVar8->m_pNext = (CNwnDoubleLinkList *)pCVar5;
        (pId->m_link).m_pNext = &pId->m_link;
        (pId->m_link).m_pPrev = &pId->m_link;
      }
      pCVar8 = &pCVar6->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar6->m_listEntryFree == pId) {
        pCVar8 = pCVar4;
      }
      pCVar4 = pCVar8->m_pNext;
      (pId->m_link).m_pNext = pCVar4;
      (pId->m_link).m_pPrev = pCVar8;
      pCVar8->m_pNext = &pId->m_link;
      pCVar4->m_pPrev = &pId->m_link;
      return this;
    }
  }
LAB_00153876:
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

YYSTYPE NscBuildIdentifier (YYSTYPE pId)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pId)
			g_pCtx ->FreePStackEntry (pId);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Search for the identifier
	//

	NscSymbol *pSymbol = g_pCtx ->FindDeclSymbol (pId ->GetIdentifier ());
	
	//
	// If the identifier wasn't found
	//

	if (pSymbol == NULL)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorUndeclaredIdentifier,
			pId ->GetIdentifier ());
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we have a good symbol
	//

	else
	{
		//
		// If we are defining the variable, the issue a warning and push the
		// default value (we can't reference the variable itself as it does not
		// yet have stack space allocated!).
		//

		if ((pSymbol ->ulFlags & NscSymFlag_BeingDefined) != 0)
		{
			if ((pSymbol ->ulFlags & NscSymFlag_SelfReferenceDef) == 0)
			{
				g_pCtx ->GenerateMessage (NscMessage_WarningIdentUsedInInitializer,
					pSymbol ->szString);
				pSymbol ->ulFlags |= NscSymFlag_SelfReferenceDef;
			}
		}

		//
		// If the symbol is a function
		//

		if (pSymbol ->nSymType == NscSymType_Function)
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorInvalidUseOfFunction,
				pId ->GetIdentifier ());
			pOut ->SetType (NscType_Error);
		}

		//
		// If the symbol is a structure
		//

		else if (pSymbol ->nSymType == NscSymType_Structure)
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorInvalidUseOfStructure,
				pId ->GetIdentifier ());
			pOut ->SetType (NscType_Error);
		}

		//
		// Otherwise, just a simple variable and not taken care of by default
		// initialization
		//

		else
		{

			//
			// Get the symbol offset
			//

			size_t nSymbol = g_pCtx ->GetSymbolOffset (pSymbol);

			//
			// If the symbol is a constant, then copy the initialization
			// code
			//

			if ((pSymbol ->ulFlags & NscSymFlag_Constant) != 0)
			{
				unsigned char *pauchInit = g_pCtx ->GetSymbolData (pSymbol ->nExtra);
				NscSymbolVariableExtra *pExtra = (NscSymbolVariableExtra *) pauchInit;
				pauchInit += sizeof (NscSymbolVariableExtra);
				pOut ->AppendData (pauchInit, pExtra ->nInitSize);
			}

			//
			// If the symbol is a global, push the variable
			//

			else if ((pSymbol ->ulFlags & NscSymFlag_Global) != 0)
			{
				pOut ->PushVariable (pSymbol ->nType, pSymbol ->nType, 
					nSymbol, -1, 0, pSymbol ->ulFlags);
			}

			//
			// If the symbol is a local, push the variable
			//

			else
			{
				pOut ->PushVariable (pSymbol ->nType, pSymbol ->nType, 
					nSymbol, -1, pSymbol ->nStackOffset, 
					pSymbol ->ulFlags);
			}

			//
			// Set the type
			//

			pOut ->SetType (pSymbol ->nType);

			//
			// Mark the symbol as referenced already (by the parser)
			//

			NscParserReferenceSymbol (pSymbol);
		}
	}

	//
	// Delete the input entry
	//

	g_pCtx ->FreePStackEntry (pId);
	return pOut;
}